

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::~FileGenerator(FileGenerator *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->options_).runtime_import_prefix._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options_).runtime_import_prefix.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->options_).named_framework_to_proto_path_mappings_path._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options_).named_framework_to_proto_path_mappings_path.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->options_).generate_for_named_framework._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options_).generate_for_named_framework.field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->options_).expected_prefixes_suppressions);
  pcVar1 = (this->options_).expected_prefixes_path._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->options_).expected_prefixes_path.field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
  ::~vector(&this->extension_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  ::~vector(&this->message_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
  ::~vector(&this->enum_generators_);
  pcVar1 = (this->root_class_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->root_class_name_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

FileGenerator::~FileGenerator() {}